

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O0

void __thiscall Assimp::ASEImporter::BuildMaterialIndices(ASEImporter *this)

{
  aiMesh *paVar1;
  undefined1 auVar2 [16];
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  ulong uVar6;
  aiMaterial **ppaVar7;
  void *pvVar8;
  aiMesh *mesh_1;
  uint iMesh_1;
  Material *submat_1;
  uint iSubMat_1;
  aiMesh *mesh;
  uint iMesh;
  Material *mat_1;
  uint iMat_1;
  uint iNum;
  Material **pcIntMaterials;
  Material *submat;
  uint iSubMat;
  Material *mat;
  uint iMat;
  ASEImporter *this_local;
  
  if (this->pcScene == (aiScene *)0x0) {
    __assert_fail("__null != pcScene",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/ASE/ASELoader.cpp"
                  ,0x4cb,"void Assimp::ASEImporter::BuildMaterialIndices()");
  }
  mat._4_4_ = 0;
  while( true ) {
    sVar3 = std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::size
                      (&this->mParser->m_vMaterials);
    if (sVar3 <= mat._4_4_) break;
    pvVar4 = std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::operator[]
                       (&this->mParser->m_vMaterials,(ulong)mat._4_4_);
    if ((pvVar4->bNeed & 1U) != 0) {
      ConvertMaterial(this,pvVar4);
      this->pcScene->mNumMaterials = this->pcScene->mNumMaterials + 1;
    }
    submat._4_4_ = 0;
    while( true ) {
      sVar3 = std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::size
                        (&pvVar4->avSubMaterials);
      if (sVar3 <= submat._4_4_) break;
      pvVar5 = std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::
               operator[](&pvVar4->avSubMaterials,(ulong)submat._4_4_);
      if ((pvVar5->bNeed & 1U) != 0) {
        ConvertMaterial(this,pvVar5);
        this->pcScene->mNumMaterials = this->pcScene->mNumMaterials + 1;
      }
      submat._4_4_ = submat._4_4_ + 1;
    }
    mat._4_4_ = mat._4_4_ + 1;
  }
  auVar2 = ZEXT416(this->pcScene->mNumMaterials) * ZEXT816(8);
  uVar6 = auVar2._0_8_;
  if (auVar2._8_8_ != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  ppaVar7 = (aiMaterial **)operator_new__(uVar6);
  this->pcScene->mMaterials = ppaVar7;
  auVar2 = ZEXT416(this->pcScene->mNumMaterials) * ZEXT816(8);
  uVar6 = auVar2._0_8_;
  if (auVar2._8_8_ != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pvVar8 = operator_new__(uVar6);
  mat_1._4_4_ = 0;
  mat_1._0_4_ = 0;
  do {
    sVar3 = std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::size
                      (&this->mParser->m_vMaterials);
    if (sVar3 <= (uint)mat_1) {
      if (pvVar8 != (void *)0x0) {
        operator_delete__(pvVar8);
      }
      return;
    }
    pvVar4 = std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::operator[]
                       (&this->mParser->m_vMaterials,(ulong)(uint)mat_1);
    if ((pvVar4->bNeed & 1U) != 0) {
      if (pvVar4->pcInstance == (aiMaterial *)0x0) {
        __assert_fail("__null != mat.pcInstance",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/ASE/ASELoader.cpp"
                      ,0x4ea,"void Assimp::ASEImporter::BuildMaterialIndices()");
      }
      this->pcScene->mMaterials[mat_1._4_4_] = pvVar4->pcInstance;
      *(reference *)((long)pvVar8 + (ulong)mat_1._4_4_ * 8) = pvVar4;
      for (mesh._4_4_ = 0; mesh._4_4_ < this->pcScene->mNumMeshes; mesh._4_4_ = mesh._4_4_ + 1) {
        paVar1 = this->pcScene->mMeshes[mesh._4_4_];
        if ((paVar1->mMaterialIndex == 0xffffffff) &&
           ((aiColor4D *)(ulong)(uint)mat_1 == paVar1->mColors[3])) {
          paVar1->mMaterialIndex = mat_1._4_4_;
          paVar1->mColors[3] = (aiColor4D *)0x0;
        }
      }
      mat_1._4_4_ = mat_1._4_4_ + 1;
    }
    submat_1._4_4_ = 0;
    while( true ) {
      sVar3 = std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::size
                        (&pvVar4->avSubMaterials);
      if (sVar3 <= submat_1._4_4_) break;
      pvVar5 = std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::
               operator[](&pvVar4->avSubMaterials,(ulong)submat_1._4_4_);
      if ((pvVar5->bNeed & 1U) != 0) {
        if (pvVar5->pcInstance == (aiMaterial *)0x0) {
          __assert_fail("__null != submat.pcInstance",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/ASE/ASELoader.cpp"
                        ,0x501,"void Assimp::ASEImporter::BuildMaterialIndices()");
        }
        this->pcScene->mMaterials[mat_1._4_4_] = pvVar5->pcInstance;
        *(reference *)((long)pvVar8 + (ulong)mat_1._4_4_ * 8) = pvVar5;
        for (mesh_1._4_4_ = 0; mesh_1._4_4_ < this->pcScene->mNumMeshes;
            mesh_1._4_4_ = mesh_1._4_4_ + 1) {
          paVar1 = this->pcScene->mMeshes[mesh_1._4_4_];
          if ((submat_1._4_4_ == paVar1->mMaterialIndex) &&
             ((aiColor4D *)(ulong)(uint)mat_1 == paVar1->mColors[3])) {
            paVar1->mMaterialIndex = mat_1._4_4_;
            paVar1->mColors[3] = (aiColor4D *)0x0;
          }
        }
        mat_1._4_4_ = mat_1._4_4_ + 1;
      }
      submat_1._4_4_ = submat_1._4_4_ + 1;
    }
    mat_1._0_4_ = (uint)mat_1 + 1;
  } while( true );
}

Assistant:

void ASEImporter::BuildMaterialIndices()
{
    ai_assert(NULL != pcScene);

    // iterate through all materials and check whether we need them
    for (unsigned int iMat = 0; iMat < mParser->m_vMaterials.size();++iMat)
    {
        ASE::Material& mat = mParser->m_vMaterials[iMat];
        if (mat.bNeed)  {
            // Convert it to the aiMaterial layout
            ConvertMaterial(mat);
            ++pcScene->mNumMaterials;
        }
        for (unsigned int iSubMat = 0; iSubMat < mat.avSubMaterials.size();++iSubMat)
        {
            ASE::Material& submat = mat.avSubMaterials[iSubMat];
            if (submat.bNeed)   {
                // Convert it to the aiMaterial layout
                ConvertMaterial(submat);
                ++pcScene->mNumMaterials;
            }
        }
    }

    // allocate the output material array
    pcScene->mMaterials = new aiMaterial*[pcScene->mNumMaterials];
    D3DS::Material** pcIntMaterials = new D3DS::Material*[pcScene->mNumMaterials];

    unsigned int iNum = 0;
    for (unsigned int iMat = 0; iMat < mParser->m_vMaterials.size();++iMat) {
        ASE::Material& mat = mParser->m_vMaterials[iMat];
        if (mat.bNeed)
        {
            ai_assert(NULL != mat.pcInstance);
            pcScene->mMaterials[iNum] = mat.pcInstance;

            // Store the internal material, too
            pcIntMaterials[iNum] = &mat;

            // Iterate through all meshes and search for one which is using
            // this top-level material index
            for (unsigned int iMesh = 0; iMesh < pcScene->mNumMeshes;++iMesh)
            {
                aiMesh* mesh = pcScene->mMeshes[iMesh];
                if (ASE::Face::DEFAULT_MATINDEX == mesh->mMaterialIndex &&
                    iMat == (uintptr_t)mesh->mColors[3])
                {
                    mesh->mMaterialIndex = iNum;
                    mesh->mColors[3] = NULL;
                }
            }
            iNum++;
        }
        for (unsigned int iSubMat = 0; iSubMat < mat.avSubMaterials.size();++iSubMat)   {
            ASE::Material& submat = mat.avSubMaterials[iSubMat];
            if (submat.bNeed)   {
                ai_assert(NULL != submat.pcInstance);
                pcScene->mMaterials[iNum] = submat.pcInstance;

                // Store the internal material, too
                pcIntMaterials[iNum] = &submat;

                // Iterate through all meshes and search for one which is using
                // this sub-level material index
                for (unsigned int iMesh = 0; iMesh < pcScene->mNumMeshes;++iMesh)   {
                    aiMesh* mesh = pcScene->mMeshes[iMesh];

                    if (iSubMat == mesh->mMaterialIndex && iMat == (uintptr_t)mesh->mColors[3]) {
                        mesh->mMaterialIndex = iNum;
                        mesh->mColors[3]     = NULL;
                    }
                }
                iNum++;
            }
        }
    }

    // Delete our temporary array
    delete[] pcIntMaterials;
}